

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O2

void logfopen(LogContext *ctx)

{
  byte bVar1;
  byte bVar2;
  strbuf *buf_o;
  LogContext *vctx;
  uchar val;
  _Bool _Var3;
  uint uVar4;
  int iVar5;
  Filename *pFVar6;
  strbuf *psVar7;
  byte *pbVar8;
  __int32_t **pp_Var9;
  size_t sVar10;
  char *__format;
  byte *pbVar11;
  byte *pbVar12;
  tm tm;
  byte local_a8;
  byte local_a7;
  uint local_84;
  strbuf *local_80;
  LogContext *local_78;
  uchar *local_70;
  tm local_68;
  
  if (ctx->state != L_CLOSED) {
    return;
  }
  if (ctx->logtype != 0) {
    ltime();
    if (ctx->currlogfilename != (Filename *)0x0) {
      filename_free(ctx->currlogfilename);
    }
    pFVar6 = conf_get_filename(ctx->conf,0x81);
    local_70 = (uchar *)conf_get_str(ctx->conf,0);
    local_78 = ctx;
    local_84 = conf_get_int(ctx->conf,1);
    psVar7 = strbuf_new();
    pbVar8 = (byte *)filename_to_str(pFVar6);
    local_80 = psVar7;
    while( true ) {
      buf_o = local_80;
      sVar10 = 1;
      bVar1 = *pbVar8;
      if (bVar1 == 0) break;
      pbVar11 = pbVar8 + 1;
      if (bVar1 == 0x26) {
        bVar2 = *pbVar11;
        if ((ulong)bVar2 == 0) {
          sVar10 = 0;
          pbVar12 = &local_a8;
        }
        else {
          pbVar11 = pbVar8 + 2;
          pp_Var9 = __ctype_tolower_loc();
          pbVar12 = local_70;
          iVar5 = (*pp_Var9)[bVar2];
          if (iVar5 == 100) {
            __format = "%d";
          }
          else {
            if (iVar5 == 0x68) {
              sVar10 = strlen((char *)local_70);
              goto LAB_00133fe0;
            }
            if (iVar5 == 0x6d) {
              __format = "%m";
            }
            else {
              if (iVar5 == 0x70) {
                uVar4 = sprintf((char *)&local_a8,"%d",(ulong)local_84);
                sVar10 = (size_t)uVar4;
                pbVar12 = &local_a8;
                goto LAB_00133fe0;
              }
              if (iVar5 == 0x74) {
                __format = "%H%M%S";
              }
              else {
                if (iVar5 != 0x79) {
                  local_a8 = 0x26;
                  pbVar12 = &local_a8;
                  if (bVar2 != 0x26) {
                    local_a7 = bVar2;
                    sVar10 = 2;
                    pbVar12 = &local_a8;
                  }
                  goto LAB_00133fe0;
                }
                __format = "%Y";
              }
            }
          }
          sVar10 = strftime((char *)&local_a8,0x20,__format,&local_68);
          pbVar12 = &local_a8;
        }
      }
      else {
        local_a8 = bVar1;
        pbVar12 = &local_a8;
      }
LAB_00133fe0:
      for (; pbVar8 = pbVar11, 0 < (int)sVar10; sVar10 = (size_t)((int)sVar10 - 1)) {
        val = *pbVar12;
        if (bVar1 == 0x26) {
          val = filename_char_sanitise(val);
        }
        BinarySink_put_byte(psVar7->binarysink_,val);
        pbVar12 = pbVar12 + 1;
      }
    }
    pFVar6 = filename_from_str(local_80->s);
    strbuf_free(buf_o);
    vctx = local_78;
    local_78->currlogfilename = pFVar6;
    _Var3 = open_for_write_would_lose_data(pFVar6);
    if (_Var3) {
      iVar5 = conf_get_int(vctx->conf,0x83);
      if (iVar5 == -1) {
        iVar5 = (*vctx->lp->vt->askappend)(vctx->lp,vctx->currlogfilename,logfopen_callback,vctx);
        if (iVar5 < 0) {
          vctx->state = L_OPENING;
          return;
        }
      }
      else {
        iVar5 = (iVar5 == 1) + 1;
      }
    }
    else {
      iVar5 = 2;
    }
    logfopen_callback(vctx,iVar5);
  }
  return;
}

Assistant:

void logfopen(LogContext *ctx)
{
    struct tm tm;
    int mode;

    /* Prevent repeat calls */
    if (ctx->state != L_CLOSED)
        return;

    if (!ctx->logtype)
        return;

    tm = ltime();

    /* substitute special codes in file name */
    if (ctx->currlogfilename)
        filename_free(ctx->currlogfilename);
    ctx->currlogfilename =
        xlatlognam(conf_get_filename(ctx->conf, CONF_logfilename),
                   conf_get_str(ctx->conf, CONF_host),
                   conf_get_int(ctx->conf, CONF_port), &tm);

    if (open_for_write_would_lose_data(ctx->currlogfilename)) {
        int logxfovr = conf_get_int(ctx->conf, CONF_logxfovr);
        if (logxfovr != LGXF_ASK) {
            mode = ((logxfovr == LGXF_OVR) ? 2 : 1);
        } else
            mode = lp_askappend(ctx->lp, ctx->currlogfilename,
                                logfopen_callback, ctx);
    } else
        mode = 2;                      /* create == overwrite */

    if (mode < 0)
        ctx->state = L_OPENING;
    else
        logfopen_callback(ctx, mode);  /* open the file */
}